

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O2

void trimCodes(string *code,string *qual,int overlap,int *rightNonOverlapGCCount,
              bool hasRightOverlap)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  difference_type dVar4;
  difference_type dVar5;
  int iVar6;
  ulong uVar7;
  string rightNonOverlap;
  string returnQual;
  string returnCode;
  allocator local_70 [32];
  string prevCount;
  
  std::__cxx11::string::string((string *)&prevCount,"0",(allocator *)&returnCode);
  std::__cxx11::string::string((string *)&returnCode,"",(allocator *)&returnQual);
  std::__cxx11::string::string((string *)&returnQual,"",(allocator *)&rightNonOverlap);
  std::__cxx11::string::string((string *)&rightNonOverlap,"",local_70);
  uVar7 = 0;
  iVar6 = 0;
  do {
    if (code->_M_string_length <= uVar7) {
LAB_0017e1da:
      std::__cxx11::string::_M_assign((string *)code);
      std::__cxx11::string::_M_assign((string *)qual);
      std::__cxx11::string::~string((string *)&rightNonOverlap);
      std::__cxx11::string::~string((string *)&returnQual);
      std::__cxx11::string::~string((string *)&returnCode);
      std::__cxx11::string::~string((string *)&prevCount);
      return;
    }
    pcVar3 = (char *)std::__cxx11::string::at((ulong)code);
    if (*pcVar3 == 'O') {
LAB_0017e0a5:
      iVar2 = std::__cxx11::stoi(&prevCount,(size_t *)0x0,10);
      iVar6 = iVar6 + iVar2 + 2;
      if (overlap <= iVar6) {
        if (hasRightOverlap) {
          std::__cxx11::string::substr((ulong)local_70,(ulong)code);
          std::__cxx11::string::operator=((string *)&rightNonOverlap,(string *)local_70);
          std::__cxx11::string::~string((string *)local_70);
          local_70[0] = (allocator)0x4f;
          dVar4 = std::
                  __count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )rightNonOverlap._M_dataplus._M_p,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(rightNonOverlap._M_dataplus._M_p + rightNonOverlap._M_string_length)
                             ,(_Iter_equals_val<const_char>)local_70);
          local_70[0] = (allocator)0x43;
          dVar5 = std::
                  __count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )rightNonOverlap._M_dataplus._M_p,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(rightNonOverlap._M_dataplus._M_p + rightNonOverlap._M_string_length)
                             ,(_Iter_equals_val<const_char>)local_70);
          *rightNonOverlapGCCount = (int)dVar5 + (int)dVar4;
        }
        goto LAB_0017e1da;
      }
      std::__cxx11::string::append((string *)&returnCode);
      std::__cxx11::string::at((ulong)code);
      std::__cxx11::string::push_back((char)&returnCode);
      std::__cxx11::string::append((string *)&returnQual);
      std::__cxx11::string::at((ulong)qual);
      std::__cxx11::string::push_back((char)&returnQual);
      std::__cxx11::string::assign((char *)&prevCount);
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::at((ulong)code);
      if (*pcVar3 == 'C') goto LAB_0017e0a5;
      bVar1 = std::operator==(&prevCount,"0");
      if (bVar1) {
        pcVar3 = (char *)std::__cxx11::string::at((ulong)code);
        std::__cxx11::string::operator=((string *)&prevCount,*pcVar3);
      }
      else {
        std::__cxx11::string::at((ulong)code);
        std::__cxx11::string::push_back((char)&prevCount);
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void trimCodes(string & code, string & qual, int overlap, int & rightNonOverlapGCCount, bool hasRightOverlap){

    int i = 0;
    string prevCount="0";
    int distance = 0;
    string returnCode = "";
    string returnQual = "";
    string rightNonOverlap = "";
    while(i<code.size()){
        if(code.at(i)=='O' || code.at(i)=='C'){
            distance += stoi(prevCount);
            distance += 2;
            if(distance>=overlap){
                if(hasRightOverlap){
                    rightNonOverlap = code.substr(i,(code.size()-i));
                    int noOs= std::count(rightNonOverlap.begin(), rightNonOverlap.end(), 'O');
                    int noCs= std::count(rightNonOverlap.begin(), rightNonOverlap.end(), 'C');
                    rightNonOverlapGCCount = noOs + noCs;
                }
                break;
            }
            returnCode += prevCount;
            returnCode += code.at(i);
            returnQual += prevCount;
            returnQual += qual.at(i);
            prevCount = "0";
        }else{
            if(prevCount=="0"){
                prevCount = code.at(i);
            }else{
                prevCount += code.at(i);
            }
        }
        i++;
    }
    code = returnCode;
    qual = returnQual;
}